

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *__ptr;
  int local_84;
  int local_80;
  int local_7c;
  uint local_78;
  int blocklen;
  uint s2;
  uint s1;
  int d_1;
  int e;
  int d;
  int n;
  uchar **hlist;
  uchar *bestloc;
  int best;
  int h;
  uchar ***hash_table;
  uchar *out;
  int local_30;
  int bitcount;
  int j;
  int i;
  uint bitbuf;
  int quality_local;
  int *out_len_local;
  uchar *puStack_10;
  int data_len_local;
  uchar *data_local;
  
  j = 0;
  out._4_4_ = 0;
  hash_table = (uchar ***)0x0;
  i = quality;
  _bitbuf = out_len;
  out_len_local._4_4_ = data_len;
  puStack_10 = data;
  __ptr = malloc(0x20000);
  if (i < 5) {
    i = 5;
  }
  if ((hash_table == (uchar ***)0x0) ||
     (*(int *)(hash_table + -1) <= *(int *)((long)hash_table + -4) + 1)) {
    stbiw__sbgrowf(&hash_table,1,1);
  }
  iVar5 = *(int *)((long)hash_table + -4);
  *(int *)((long)hash_table + -4) = iVar5 + 1;
  *(undefined1 *)((long)hash_table + (long)iVar5) = 0x78;
  if ((hash_table == (uchar ***)0x0) ||
     (*(int *)(hash_table + -1) <= *(int *)((long)hash_table + -4) + 1)) {
    stbiw__sbgrowf(&hash_table,1,1);
  }
  iVar5 = *(int *)((long)hash_table + -4);
  *(int *)((long)hash_table + -4) = iVar5 + 1;
  *(undefined1 *)((long)hash_table + (long)iVar5) = 0x5e;
  j = 1 << ((byte)out._4_4_ & 0x1f) | j;
  out._4_4_ = out._4_4_ + 1;
  hash_table = (uchar ***)stbiw__zlib_flushf((uchar *)hash_table,(uint *)&j,(int *)((long)&out + 4))
  ;
  j = 1 << ((byte)out._4_4_ & 0x1f) | j;
  out._4_4_ = out._4_4_ + 2;
  hash_table = (uchar ***)stbiw__zlib_flushf((uchar *)hash_table,(uint *)&j,(int *)((long)&out + 4))
  ;
  for (bitcount = 0; bitcount < 0x4000; bitcount = bitcount + 1) {
    *(undefined8 *)((long)__ptr + (long)bitcount * 8) = 0;
  }
  bitcount = 0;
  do {
    if (out_len_local._4_4_ + -3 <= bitcount) {
      for (; bitcount < out_len_local._4_4_; bitcount = bitcount + 1) {
        if (puStack_10[bitcount] < 0x90) {
          iVar5 = stbiw__zlib_bitrev(puStack_10[bitcount] + 0x30,8);
          j = iVar5 << ((byte)out._4_4_ & 0x1f) | j;
          out._4_4_ = out._4_4_ + 8;
          hash_table = (uchar ***)
                       stbiw__zlib_flushf((uchar *)hash_table,(uint *)&j,(int *)((long)&out + 4));
        }
        else {
          iVar5 = stbiw__zlib_bitrev(puStack_10[bitcount] + 0x100,9);
          j = iVar5 << ((byte)out._4_4_ & 0x1f) | j;
          out._4_4_ = out._4_4_ + 9;
          hash_table = (uchar ***)
                       stbiw__zlib_flushf((uchar *)hash_table,(uint *)&j,(int *)((long)&out + 4));
        }
      }
      iVar5 = stbiw__zlib_bitrev(0,7);
      j = iVar5 << ((byte)out._4_4_ & 0x1f) | j;
      out._4_4_ = out._4_4_ + 7;
      hash_table = (uchar ***)
                   stbiw__zlib_flushf((uchar *)hash_table,(uint *)&j,(int *)((long)&out + 4));
      while (out._4_4_ != 0) {
        j = 0 << ((byte)out._4_4_ & 0x1f) | j;
        out._4_4_ = out._4_4_ + 1;
        hash_table = (uchar ***)
                     stbiw__zlib_flushf((uchar *)hash_table,(uint *)&j,(int *)((long)&out + 4));
      }
      for (bitcount = 0; bitcount < 0x4000; bitcount = bitcount + 1) {
        if (*(long *)((long)__ptr + (long)bitcount * 8) != 0) {
          free((void *)(*(long *)((long)__ptr + (long)bitcount * 8) + -8));
        }
      }
      free(__ptr);
      blocklen = 1;
      local_78 = 0;
      local_7c = out_len_local._4_4_ % 0x15b0;
      local_30 = 0;
      while (local_30 < out_len_local._4_4_) {
        for (bitcount = 0; bitcount < local_7c; bitcount = bitcount + 1) {
          blocklen = (uint)puStack_10[local_30 + bitcount] + blocklen;
          local_78 = blocklen + local_78;
        }
        blocklen = (uint)blocklen % 0xfff1;
        local_78 = local_78 % 0xfff1;
        local_30 = local_7c + local_30;
        local_7c = 0x15b0;
      }
      if ((hash_table == (uchar ***)0x0) ||
         (*(int *)(hash_table + -1) <= *(int *)((long)hash_table + -4) + 1)) {
        stbiw__sbgrowf(&hash_table,1,1);
      }
      iVar5 = *(int *)((long)hash_table + -4);
      *(int *)((long)hash_table + -4) = iVar5 + 1;
      *(char *)((long)hash_table + (long)iVar5) = (char)(local_78 >> 8);
      if ((hash_table == (uchar ***)0x0) ||
         (*(int *)(hash_table + -1) <= *(int *)((long)hash_table + -4) + 1)) {
        stbiw__sbgrowf(&hash_table,1,1);
      }
      iVar5 = *(int *)((long)hash_table + -4);
      *(int *)((long)hash_table + -4) = iVar5 + 1;
      *(char *)((long)hash_table + (long)iVar5) = (char)local_78;
      if ((hash_table == (uchar ***)0x0) ||
         (*(int *)(hash_table + -1) <= *(int *)((long)hash_table + -4) + 1)) {
        stbiw__sbgrowf(&hash_table,1,1);
      }
      iVar5 = *(int *)((long)hash_table + -4);
      *(int *)((long)hash_table + -4) = iVar5 + 1;
      *(char *)((long)hash_table + (long)iVar5) = (char)((uint)blocklen >> 8);
      if ((hash_table == (uchar ***)0x0) ||
         (*(int *)(hash_table + -1) <= *(int *)((long)hash_table + -4) + 1)) {
        stbiw__sbgrowf(&hash_table,1,1);
      }
      iVar5 = *(int *)((long)hash_table + -4);
      *(int *)((long)hash_table + -4) = iVar5 + 1;
      *(char *)((long)hash_table + (long)iVar5) = (char)blocklen;
      *_bitbuf = *(int *)((long)hash_table + -4);
      memmove(hash_table + -1,hash_table,(long)*_bitbuf);
      return (uchar *)(hash_table + -1);
    }
    uVar3 = stbiw__zhash(puStack_10 + bitcount);
    uVar3 = uVar3 & 0x3fff;
    bestloc._0_4_ = 3;
    hlist = (uchar **)0x0;
    lVar1 = *(long *)((long)__ptr + (long)(int)uVar3 * 8);
    if (lVar1 == 0) {
      local_80 = 0;
    }
    else {
      local_80 = *(int *)(lVar1 + -4);
    }
    for (local_30 = 0; local_30 < local_80; local_30 = local_30 + 1) {
      if (((long)(bitcount + -0x8000) < *(long *)(lVar1 + (long)local_30 * 8) - (long)puStack_10) &&
         (uVar4 = stbiw__zlib_countm(*(uchar **)(lVar1 + (long)local_30 * 8),puStack_10 + bitcount,
                                     out_len_local._4_4_ - bitcount),
         (int)(uint)bestloc <= (int)uVar4)) {
        hlist = *(uchar ***)(lVar1 + (long)local_30 * 8);
        bestloc._0_4_ = uVar4;
      }
    }
    if ((*(long *)((long)__ptr + (long)(int)uVar3 * 8) != 0) &&
       (*(int *)(*(long *)((long)__ptr + (long)(int)uVar3 * 8) + -4) == i * 2)) {
      memmove(*(void **)((long)__ptr + (long)(int)uVar3 * 8),
              (void *)(*(long *)((long)__ptr + (long)(int)uVar3 * 8) + (long)i * 8),(long)i << 3);
      *(int *)(*(long *)((long)__ptr + (long)(int)uVar3 * 8) + -4) = i;
    }
    if ((*(long *)((long)__ptr + (long)(int)uVar3 * 8) == 0) ||
       (*(int *)(*(long *)((long)__ptr + (long)(int)uVar3 * 8) + -8) <=
        *(int *)(*(long *)((long)__ptr + (long)(int)uVar3 * 8) + -4) + 1)) {
      stbiw__sbgrowf((void **)((long)__ptr + (long)(int)uVar3 * 8),1,8);
    }
    lVar1 = *(long *)((long)__ptr + (long)(int)uVar3 * 8);
    lVar2 = *(long *)((long)__ptr + (long)(int)uVar3 * 8);
    iVar5 = *(int *)(lVar2 + -4);
    *(int *)(lVar2 + -4) = iVar5 + 1;
    *(uchar **)(lVar1 + (long)iVar5 * 8) = puStack_10 + bitcount;
    if (hlist != (uchar **)0x0) {
      uVar3 = stbiw__zhash(puStack_10 + (long)bitcount + 1);
      lVar1 = *(long *)((long)__ptr + (long)(int)(uVar3 & 0x3fff) * 8);
      if (lVar1 == 0) {
        local_84 = 0;
      }
      else {
        local_84 = *(int *)(lVar1 + -4);
      }
      for (local_30 = 0; local_30 < local_84; local_30 = local_30 + 1) {
        if (((long)(bitcount + -0x7fff) < *(long *)(lVar1 + (long)local_30 * 8) - (long)puStack_10)
           && (uVar3 = stbiw__zlib_countm(*(uchar **)(lVar1 + (long)local_30 * 8),
                                          puStack_10 + (long)bitcount + 1,
                                          (out_len_local._4_4_ - bitcount) + -1),
              (int)(uint)bestloc < (int)uVar3)) {
          hlist = (uchar **)0x0;
          break;
        }
      }
    }
    if (hlist == (uchar **)0x0) {
      if (puStack_10[bitcount] < 0x90) {
        iVar5 = stbiw__zlib_bitrev(puStack_10[bitcount] + 0x30,8);
        j = iVar5 << ((byte)out._4_4_ & 0x1f) | j;
        out._4_4_ = out._4_4_ + 8;
        hash_table = (uchar ***)
                     stbiw__zlib_flushf((uchar *)hash_table,(uint *)&j,(int *)((long)&out + 4));
      }
      else {
        iVar5 = stbiw__zlib_bitrev(puStack_10[bitcount] + 0x100,9);
        j = iVar5 << ((byte)out._4_4_ & 0x1f) | j;
        out._4_4_ = out._4_4_ + 9;
        hash_table = (uchar ***)
                     stbiw__zlib_flushf((uchar *)hash_table,(uint *)&j,(int *)((long)&out + 4));
      }
      bitcount = bitcount + 1;
    }
    else {
      iVar5 = ((int)puStack_10 + bitcount) - (int)hlist;
      if ((0x7fff < iVar5) || (0x102 < (int)(uint)bestloc)) {
        __assert_fail("d <= 32767 && best <= 258",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/stb_image_write.h"
                      ,0x315,"unsigned char *stbi_zlib_compress(unsigned char *, int, int *, int)");
      }
      local_30 = 0;
      while ((int)(stbi_zlib_compress::lengthc[local_30 + 1] - 1) < (int)(uint)bestloc) {
        local_30 = local_30 + 1;
      }
      if (local_30 + 0x101 < 0x90) {
        iVar6 = stbiw__zlib_bitrev(local_30 + 0x131,8);
        j = iVar6 << ((byte)out._4_4_ & 0x1f) | j;
        out._4_4_ = out._4_4_ + 8;
        hash_table = (uchar ***)
                     stbiw__zlib_flushf((uchar *)hash_table,(uint *)&j,(int *)((long)&out + 4));
      }
      else if (local_30 + 0x101 < 0x100) {
        iVar6 = stbiw__zlib_bitrev(local_30 + 0x201,9);
        j = iVar6 << ((byte)out._4_4_ & 0x1f) | j;
        out._4_4_ = out._4_4_ + 9;
        hash_table = (uchar ***)
                     stbiw__zlib_flushf((uchar *)hash_table,(uint *)&j,(int *)((long)&out + 4));
      }
      else if (local_30 + 0x101 < 0x118) {
        iVar6 = stbiw__zlib_bitrev(local_30 + 1,7);
        j = iVar6 << ((byte)out._4_4_ & 0x1f) | j;
        out._4_4_ = out._4_4_ + 7;
        hash_table = (uchar ***)
                     stbiw__zlib_flushf((uchar *)hash_table,(uint *)&j,(int *)((long)&out + 4));
      }
      else {
        iVar6 = stbiw__zlib_bitrev(local_30 + 0xa9,8);
        j = iVar6 << ((byte)out._4_4_ & 0x1f) | j;
        out._4_4_ = out._4_4_ + 8;
        hash_table = (uchar ***)
                     stbiw__zlib_flushf((uchar *)hash_table,(uint *)&j,(int *)((long)&out + 4));
      }
      if (stbi_zlib_compress::lengtheb[local_30] != '\0') {
        j = (uint)bestloc - stbi_zlib_compress::lengthc[local_30] << ((byte)out._4_4_ & 0x1f) | j;
        out._4_4_ = (uint)stbi_zlib_compress::lengtheb[local_30] + out._4_4_;
        hash_table = (uchar ***)
                     stbiw__zlib_flushf((uchar *)hash_table,(uint *)&j,(int *)((long)&out + 4));
      }
      local_30 = 0;
      while ((int)(stbi_zlib_compress::distc[local_30 + 1] - 1) < iVar5) {
        local_30 = local_30 + 1;
      }
      iVar6 = stbiw__zlib_bitrev(local_30,5);
      j = iVar6 << ((byte)out._4_4_ & 0x1f) | j;
      out._4_4_ = out._4_4_ + 5;
      hash_table = (uchar ***)
                   stbiw__zlib_flushf((uchar *)hash_table,(uint *)&j,(int *)((long)&out + 4));
      if (stbi_zlib_compress::disteb[local_30] != '\0') {
        j = iVar5 - (uint)stbi_zlib_compress::distc[local_30] << ((byte)out._4_4_ & 0x1f) | j;
        out._4_4_ = (uint)stbi_zlib_compress::disteb[local_30] + out._4_4_;
        hash_table = (uchar ***)
                     stbiw__zlib_flushf((uchar *)hash_table,(uint *)&j,(int *)((long)&out + 4));
      }
      bitcount = (uint)bestloc + bitcount;
    }
  } while( true );
}

Assistant:

unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char ***hash_table = (unsigned char***) STBIW_MALLOC(stbiw__ZHASH * sizeof(char**));
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) best=d,bestloc=hlist[j];
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);
   STBIW_FREE(hash_table);

   {
      // compute adler32 on input
      unsigned int s1=1, s2=0;
      int blocklen = (int) (data_len % 5552);
      j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) s1 += data[j+i], s2 += s1;
         s1 %= 65521, s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, STBIW_UCHAR(s2 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s2));
      stbiw__sbpush(out, STBIW_UCHAR(s1 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s1));
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
}